

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_required<std::__cxx11::string>
          (Parser *this,string *name,string *alternative,string *description,bool dominant)

{
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50 [3];
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *command;
  string *psStack_28;
  bool dominant_local;
  string *description_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command._7_1_ = dominant;
  psStack_28 = description;
  description_local = alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0xd0);
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CmdArgument(this_00,alternative_local,description_local,psStack_28,true,(bool)(command._7_1_ & 1))
  ;
  local_50[0] = this_00;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_50);
  return;
}

Assistant:

void set_required(const std::string& name, const std::string& alternative, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, true, dominant };
			_commands.push_back(command);
		}